

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O1

IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>_>
* __thiscall
Lib::
concatIters<Lib::VirtualIterator<Indexing::TermLiteralClause>,Lib::VirtualIterator<Indexing::TermLiteralClause>>
          (IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>_>
           *__return_storage_ptr__,Lib *this,VirtualIterator<Indexing::TermLiteralClause> *i1,
          VirtualIterator<Indexing::TermLiteralClause> *i2)

{
  int *piVar1;
  long *plVar2;
  long *plVar3;
  IteratorCore<Indexing::TermLiteralClause> *pIVar4;
  CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
  *extraout_RDX;
  CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
  *extraout_RDX_00;
  Lib local_30 [8];
  long *local_28;
  IteratorCore<Indexing::TermLiteralClause> *local_20;
  
  plVar3 = *(long **)this;
  if (plVar3 != (long *)0x0) {
    *(int *)(plVar3 + 1) = (int)plVar3[1] + 1;
  }
  pIVar4 = i1->_core;
  if (pIVar4 != (IteratorCore<Indexing::TermLiteralClause> *)0x0) {
    piVar1 = &pIVar4->_refCnt;
    *piVar1 = *piVar1 + 3;
    if (*piVar1 == 0) {
      (*pIVar4->_vptr_IteratorCore[1])(pIVar4);
      i1 = (VirtualIterator<Indexing::TermLiteralClause> *)extraout_RDX;
    }
    if (pIVar4 != (IteratorCore<Indexing::TermLiteralClause> *)0x0) {
      piVar1 = &pIVar4->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*pIVar4->_vptr_IteratorCore[1])(pIVar4);
        i1 = (VirtualIterator<Indexing::TermLiteralClause> *)extraout_RDX_00;
      }
    }
  }
  local_30[0] = (Lib)0x1;
  if (plVar3 != (long *)0x0) {
    *(int *)(plVar3 + 1) = (int)plVar3[1] + 1;
  }
  if (pIVar4 != (IteratorCore<Indexing::TermLiteralClause> *)0x0) {
    pIVar4->_refCnt = pIVar4->_refCnt + 1;
  }
  local_28 = plVar3;
  local_20 = pIVar4;
  iterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>>>>
            (__return_storage_ptr__,local_30,
             (CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
              *)i1);
  if (local_20 != (IteratorCore<Indexing::TermLiteralClause> *)0x0) {
    piVar1 = &local_20->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*local_20->_vptr_IteratorCore[1])();
    }
  }
  if (local_28 != (long *)0x0) {
    plVar2 = local_28 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    if ((int)*plVar2 == 0) {
      (**(code **)(*local_28 + 8))();
    }
  }
  if (pIVar4 != (IteratorCore<Indexing::TermLiteralClause> *)0x0) {
    piVar1 = &pIVar4->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*pIVar4->_vptr_IteratorCore[1])(pIVar4);
    }
    if (pIVar4 != (IteratorCore<Indexing::TermLiteralClause> *)0x0) {
      piVar1 = &pIVar4->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*pIVar4->_vptr_IteratorCore[1])(pIVar4);
      }
    }
  }
  if (plVar3 != (long *)0x0) {
    plVar2 = plVar3 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    if ((int)*plVar2 == 0) {
      (**(code **)(*plVar3 + 8))(plVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static auto concatIters(I1 i1, I2 i2, Is... is) 
{ return iterTraits(CatIterator<I1, decltype(concatIters(std::move(i2), std::move(is)...))>(std::move(i1), concatIters(std::move(i2), std::move(is)...))); }